

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_error.cpp
# Opt level: O1

void __thiscall
ON_ErrorEvent::ON_ErrorEvent
          (ON_ErrorEvent *this,Type event_type,char *file_name,uint line_number,char *function_name,
          char *description)

{
  long lVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  long lVar10;
  
  this->m_event_type = event_type;
  this->m_reserved1 = '\0';
  this->m_reserved2 = 0;
  this->m_line_number = line_number;
  memset(&this->m_file_name,0,0x98);
  uVar2 = ON_String::Length(file_name);
  lVar10 = (long)(int)uVar2;
  uVar3 = ON_String::Length(function_name);
  uVar8 = (ulong)(int)uVar3;
  iVar4 = ON_String::Length(description);
  uVar5 = (ulong)iVar4;
  if ((uVar8 + lVar10 + uVar5) - 0x7e < 0xffffffffffffff7f) {
    lVar1 = lVar10 + -0x20;
    if (0x20 < uVar2) {
      lVar10 = 0x20;
      file_name = file_name + lVar1;
    }
    lVar1 = uVar8 - 0x20;
    if (0x20 < uVar3 && (uVar8 + lVar10 + uVar5) - 0x7e < 0xffffffffffffff7f) {
      uVar8 = 0x20;
      function_name = function_name + lVar1;
    }
  }
  if (lVar10 == 0) {
    uVar6 = 0x20;
  }
  else {
    this->m_file_name = this->m_buffer;
    uVar9 = 0x7e;
    if (lVar10 - 1U < 0x7e) {
      uVar9 = lVar10 - 1U;
    }
    uVar7 = 0x1f;
    do {
      uVar6 = uVar7;
      this->m_buffer[uVar6 - 0x1f] = file_name[uVar6 - 0x1f];
      uVar7 = uVar6 + 1;
    } while (uVar6 - uVar9 != 0x1f);
    if (uVar6 + 1 < 0x9e) {
      this->m_buffer[uVar6 - 0x1e] = '\0';
      uVar6 = uVar6 + 3;
    }
    else {
      uVar6 = uVar6 + 2;
    }
  }
  if ((long)uVar6 < 0x9f && uVar8 != 0) {
    this->m_function_name = this->m_buffer + (uVar6 - 0x20);
    uVar9 = 1;
    do {
      uVar7 = uVar6;
      uVar6 = uVar7 + 1;
      this->m_buffer[uVar7 - 0x20] = function_name[uVar9 - 1];
      if (uVar8 <= uVar9) break;
      uVar9 = uVar9 + 1;
    } while (uVar7 < 0x9e);
    if (uVar7 < 0x9e) {
      this->m_buffer[uVar7 - 0x1f] = '\0';
      uVar6 = uVar7 + 2;
    }
  }
  if ((iVar4 != 0) && ((long)uVar6 < 0x9f)) {
    this->m_description = this->m_buffer + (uVar6 - 0x20);
    uVar8 = 1;
    do {
      uVar9 = uVar6;
      this->m_buffer[uVar9 - 0x20] = description[uVar8 - 1];
      if (uVar5 <= uVar8) break;
      uVar8 = uVar8 + 1;
      uVar6 = uVar9 + 1;
    } while (uVar9 < 0x9e);
    if (uVar9 < 0x9e) {
      this->m_buffer[uVar9 - 0x1f] = '\0';
    }
  }
  this->m_buffer[0x7f] = '\0';
  return;
}

Assistant:

ON_ErrorEvent::ON_ErrorEvent(
  ON_ErrorEvent::Type event_type,
  const char* file_name,
  unsigned int line_number,
  const char* function_name,
  const char* description
)
  : m_event_type(event_type)
  , m_line_number(line_number)
{
  const size_t buffer_capacity = sizeof(m_buffer) / sizeof(m_buffer[0]);
  size_t file_name_length = ON_String::Length(file_name);
  size_t function_name_length = ON_String::Length(function_name);
  size_t description_length = ON_String::Length(description);
  if (file_name_length + function_name_length + description_length + 3 > buffer_capacity)
  {
    const size_t cap = buffer_capacity / 4;
    if (file_name_length > cap )
    {
      file_name += (file_name_length - cap);
      file_name_length = cap;
    }
    if (file_name_length + function_name_length + description_length + 3 > buffer_capacity)
    {
      if (function_name_length > cap)
      {
        function_name += (function_name_length - cap);
        function_name_length = cap;
      }
    }
  }

  char* c = m_buffer;
  char* c1 = m_buffer + (buffer_capacity - 1);

  if (file_name_length > 0 && c < c1)
  {
    m_file_name = c;
    for (size_t i = 0; i < file_name_length && c < c1; i++)
      *c++ = file_name[i];
    if (c < c1)
      *c++ = 0;
  }

  if (function_name_length > 0 && c < c1)
  {
    m_function_name = c;
    for (size_t i = 0; i < function_name_length && c < c1; i++)
      *c++ = function_name[i];
    if (c < c1)
      *c++ = 0;
  }

  if (description_length > 0 && c < c1)
  {
    m_description = c;
    for (size_t i = 0; i < description_length && c < c1; i++)
      *c++ = description[i];
    if (c < c1)
      *c++ = 0;
  }

  *c1 = 0;
}